

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

float __thiscall LLVMBC::APFloat::convertToFloat(APFloat *this)

{
  TypeID TVar1;
  LoggingCallback p_Var2;
  void *pvVar3;
  float fVar4;
  char buffer [4096];
  char local_1018 [4104];
  
  TVar1 = Type::getTypeID(this->type);
  if (TVar1 == DoubleTyID) {
    fVar4 = (float)(double)this->value;
  }
  else if (TVar1 == FloatTyID) {
    fVar4 = *(float *)&this->value;
  }
  else {
    p_Var2 = ::dxil_spv::get_thread_log_callback();
    if (p_Var2 == (LoggingCallback)0x0) {
      convertToFloat();
    }
    else {
      builtin_strncpy(local_1018 + 0x10,"in APFloat::convertToFloat().\n",0x1f);
      builtin_strncpy(local_1018,"Unknown FP type ",0x10);
      pvVar3 = ::dxil_spv::get_thread_log_callback_userdata();
      (*p_Var2)(pvVar3,Error,local_1018);
    }
    fVar4 = 0.0;
  }
  return fVar4;
}

Assistant:

float APFloat::convertToFloat() const
{
	switch (type->getTypeID())
	{
	case Type::TypeID::FloatTyID:
	{
		float f;
		auto u = uint32_t(value);
		static_assert(sizeof(f) == sizeof(u), "Float is not 32-bit.");
		memcpy(&f, &u, sizeof(float));
		return f;
	}
	case Type::TypeID::DoubleTyID:
	{
		double f;
		static_assert(sizeof(f) == sizeof(value), "Double is not 64-bit.");
		memcpy(&f, &value, sizeof(double));
		return float(f);
	}

	default:
		LOGE("Unknown FP type in APFloat::convertToFloat().\n");
		return 0.0f;
	}
}